

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

bool __thiscall Loader::eraseFlash(Loader *this,string *loaderFile)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_aa;
  allocator local_a9;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Initializing FPGA...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_40,(string *)loaderFile);
  bVar1 = loadBin(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    bVar1 = Jtag::setFreq(this->device,1500000.0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Erasing...");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = setIR(this,USER1);
      if (!bVar1) {
        return false;
      }
      std::__cxx11::string::string((string *)&local_60,"0",(allocator *)&local_a8);
      std::__cxx11::string::string((string *)&local_80,"",&local_a9);
      std::__cxx11::string::string((string *)&local_a0,"",&local_aa);
      bVar1 = shiftDR(this,1,&local_60,&local_80,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      if (!bVar1) {
        return false;
      }
      local_a8.__r = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_a8);
      bVar1 = setIR(this,JPROGRAM);
      if (!bVar1) {
        return false;
      }
      bVar1 = resetState(this);
      return bVar1;
    }
    pcVar3 = "Failed to set JTAG frequency!";
  }
  else {
    pcVar3 = "Failed to initialize FPGA!";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool Loader::eraseFlash(string loaderFile) {
	cout << "Initializing FPGA..." << endl;
	if (!loadBin(loaderFile)) {
		cerr << "Failed to initialize FPGA!" << endl;
		return false;
	}

	if (!device->setFreq(1500000)) {
		cerr << "Failed to set JTAG frequency!" << endl;
		return false;
	}

	cout << "Erasing..." << endl;

	// Erase the flash
	if (!setIR(USER1))
		return false;

	if (!shiftDR(1, "0", "", ""))
		return false;

	std::this_thread::sleep_for(std::chrono::seconds(1)); // wait for erase

	if (!setIR(JPROGRAM))
		return false;

	// reset just for good measure
	if (!resetState())
		return false;

	return true;
}